

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssvectorbase.h
# Opt level: O3

void __thiscall
soplex::
SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::clearIdx(SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,int i)

{
  int iVar1;
  int *piVar2;
  uint uVar3;
  
  if (this->setupStatus == true) {
    uVar3 = IdxSet::pos(&this->super_IdxSet,i);
    if (-1 < (int)uVar3) {
      piVar2 = (this->super_IdxSet).idx;
      iVar1 = (this->super_IdxSet).num;
      (this->super_IdxSet).num = iVar1 + -1;
      piVar2[uVar3] = piVar2[(long)iVar1 + -1];
    }
  }
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
            (&(this->
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[i].m_backend,0);
  return;
}

Assistant:

void clearIdx(int i)
   {
      if(isSetup())
      {
         int n = pos(i);

         if(n >= 0)
            remove(n);
      }

      VectorBase<R>::val[i] = 0;

      assert(isConsistent());
   }